

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

bool __thiscall QMYSQLResult::fetch(QMYSQLResult *this,int i)

{
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QArrayData *local_48 [3];
  QSqlError local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar5 = QSqlResult::driver();
  if (lVar5 == 0) {
LAB_00109c14:
    bVar6 = false;
  }
  else {
    cVar2 = QSqlResult::isForwardOnly();
    iVar4 = QSqlResult::at();
    if (cVar2 != '\0') {
      if (iVar4 < i) {
        iVar4 = QSqlResult::at();
        iVar4 = iVar4 - i;
        do {
          iVar4 = iVar4 + 1;
          if (iVar4 == 0) break;
          cVar2 = (**(code **)(*(long *)this + 0x90))(this);
        } while (cVar2 != '\0');
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          uVar3 = (**(code **)(*(long *)this + 0x90))(this);
          return (bool)uVar3;
        }
        goto LAB_00109c35;
      }
      goto LAB_00109c14;
    }
    bVar6 = true;
    if (iVar4 != i) {
      if (*(char *)(lVar1 + 0xfd) == '\x01') {
        mysql_stmt_data_seek(*(undefined8 *)(lVar1 + 0xd8));
        iVar4 = mysql_stmt_fetch(*(undefined8 *)(lVar1 + 0xd8));
        if (iVar4 == 0) {
LAB_00109c07:
          (**(code **)(*(long *)this + 0x18))(this,i);
          goto LAB_00109c17;
        }
        if ((iVar4 == 0x65) || (iVar4 == 1)) {
          QCoreApplication::translate((char *)local_48,"QMYSQLResult","Unable to fetch data",0);
          qMakeStmtError((QString *)local_30,(ErrorType)local_48,*(MYSQL_STMT **)(lVar1 + 0xd8));
          (**(code **)(*(long *)this + 0x28))(this,local_30);
          QSqlError::~QSqlError(local_30);
          if (local_48[0] != (QArrayData *)0x0) {
            LOCK();
            (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_48[0],2,0x10);
            }
          }
        }
      }
      else {
        mysql_data_seek(*(undefined8 *)(lVar1 + 0xb0),(long)i);
        lVar5 = mysql_fetch_row(*(undefined8 *)(lVar1 + 0xb0));
        *(long *)(lVar1 + 0xb8) = lVar5;
        if (lVar5 != 0) goto LAB_00109c07;
      }
      goto LAB_00109c14;
    }
  }
LAB_00109c17:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar6;
  }
LAB_00109c35:
  __stack_chk_fail();
}

Assistant:

bool QMYSQLResult::fetch(int i)
{
    Q_D(QMYSQLResult);
    if (!driver())
        return false;
    if (isForwardOnly()) { // fake a forward seek
        if (at() < i) {
            int x = i - at();
            while (--x && fetchNext()) {};
            return fetchNext();
        } else {
            return false;
        }
    }
    if (at() == i)
        return true;
    if (d->preparedQuery) {
        mysql_stmt_data_seek(d->stmt, i);

        int nRC = mysql_stmt_fetch(d->stmt);
        if (nRC) {
            if (nRC == 1 || nRC == MYSQL_DATA_TRUNCATED)
                setLastError(qMakeStmtError(QCoreApplication::translate("QMYSQLResult",
                         "Unable to fetch data"), QSqlError::StatementError, d->stmt));
            return false;
        }
    } else {
        mysql_data_seek(d->result, i);
        d->row = mysql_fetch_row(d->result);
        if (!d->row)
            return false;
    }

    setAt(i);
    return true;
}